

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCStreamSize_usingCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  undefined1 auVar1 [20];
  int iVar2;
  void *pvVar3;
  undefined8 in_stack_ffffffffffffff14;
  void *local_e0;
  size_t rowCCtxSize;
  size_t noRowCCtxSize;
  ZSTD_CCtx_params initialParams;
  
  auVar1 = cParams._0_20_;
  cParams_00._20_8_ = in_stack_ffffffffffffff14;
  cParams_00.windowLog = auVar1._0_4_;
  cParams_00.chainLog = auVar1._4_4_;
  cParams_00.hashLog = auVar1._8_4_;
  cParams_00.searchLog = auVar1._12_4_;
  cParams_00.minMatch = auVar1._16_4_;
  ZSTD_makeCCtxParamsFromCParams(cParams_00);
  iVar2 = ZSTD_rowMatchFinderSupported(cParams.minMatch);
  if (iVar2 == 0) {
    initialParams.customMem.opaque =
         (void *)ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&noRowCCtxSize);
  }
  else {
    initialParams.validateSequences = 1;
    pvVar3 = (void *)ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&noRowCCtxSize);
    initialParams.validateSequences = 2;
    local_e0 = (void *)ZSTD_estimateCStreamSize_usingCCtxParams((ZSTD_CCtx_params *)&noRowCCtxSize);
    if (local_e0 < pvVar3) {
      local_e0 = pvVar3;
    }
    initialParams.customMem.opaque = local_e0;
  }
  return (size_t)initialParams.customMem.opaque;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCParams(ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params initialParams = ZSTD_makeCCtxParamsFromCParams(cParams);
    if (ZSTD_rowMatchFinderSupported(cParams.strategy)) {
        /* Pick bigger of not using and using row-based matchfinder for greedy and lazy strategies */
        size_t noRowCCtxSize;
        size_t rowCCtxSize;
        initialParams.useRowMatchFinder = ZSTD_urm_disableRowMatchFinder;
        noRowCCtxSize = ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
        initialParams.useRowMatchFinder = ZSTD_urm_enableRowMatchFinder;
        rowCCtxSize = ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
        return MAX(noRowCCtxSize, rowCCtxSize);
    } else {
        return ZSTD_estimateCStreamSize_usingCCtxParams(&initialParams);
    }
}